

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphBuilder.cpp
# Opt level: O1

bool __thiscall
dg::llvmdg::legacy::GraphBuilder::createPthreadCreate
          (GraphBuilder *this,CallInst *callInst,Block *lastBlock)

{
  Function *llvmFunction;
  Function **ppFVar1;
  Function **ppFVar2;
  iterator iVar3;
  Function **ppFVar4;
  iterator iVar5;
  Function *function;
  vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_> *__range2;
  iterator __end2;
  pointer ppFVar6;
  vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_> forkFunctionsWithBlock;
  Function *forkFunction;
  vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_> forkFunctions;
  Function **local_68;
  iterator iStack_60;
  Function **local_58;
  Function *local_50;
  vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_> local_48;
  
  getCalledFunctions(&local_48,this,
                     *(Value **)(callInst + (0x40 - (ulong)(uint)(*(int *)(callInst + 0x14) << 5))))
  ;
  local_68 = (Function **)0x0;
  iStack_60._M_current = (Function **)0x0;
  local_58 = (Function **)0x0;
  ppFVar1 = local_68;
  ppFVar2 = local_68;
  iVar3._M_current = iStack_60._M_current;
  if (local_48.super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_48.super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    ppFVar6 = local_48.
              super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    do {
      local_50 = *ppFVar6;
      if (*(Function **)(local_50 + 0x48) != local_50 + 0x48) {
        if (iStack_60._M_current == local_58) {
          std::vector<llvm::Function_const*,std::allocator<llvm::Function_const*>>::
          _M_realloc_insert<llvm::Function_const*const&>
                    ((vector<llvm::Function_const*,std::allocator<llvm::Function_const*>> *)
                     &local_68,iStack_60,&local_50);
        }
        else {
          *iStack_60._M_current = local_50;
          iStack_60._M_current = iStack_60._M_current + 1;
        }
      }
      ppFVar6 = ppFVar6 + 1;
      ppFVar1 = local_68;
      ppFVar2 = local_68;
      iVar3._M_current = iStack_60._M_current;
    } while (ppFVar6 !=
             local_48.
             super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  for (; iVar5._M_current = iStack_60._M_current, ppFVar4 = local_68, local_68 = ppFVar2,
      ppFVar1 != iStack_60._M_current; ppFVar1 = ppFVar1 + 1) {
    llvmFunction = *ppFVar1;
    iStack_60._M_current = iVar3._M_current;
    function = createOrGetFunction(this,llvmFunction);
    Block::addFork(lastBlock,llvmFunction,function);
    ppFVar2 = local_68;
    iVar3._M_current = iStack_60._M_current;
    iStack_60._M_current = iVar5._M_current;
    local_68 = ppFVar4;
  }
  iStack_60._M_current = iVar3._M_current;
  if (ppFVar2 != (Function **)0x0) {
    operator_delete(ppFVar2,(long)local_58 - (long)ppFVar2);
  }
  if (local_48.super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return iVar5._M_current != ppFVar4;
}

Assistant:

bool GraphBuilder::createPthreadCreate(const llvm::CallInst *callInst,
                                       Block *lastBlock) {
    bool createBlock = false;
    llvm::Value *calledValue = callInst->getArgOperand(2);
    auto forkFunctions = getCalledFunctions(calledValue);
    std::vector<const llvm::Function *> forkFunctionsWithBlock;
    for (const auto *forkFunction : forkFunctions) {
        if (!forkFunction->empty()) {
            forkFunctionsWithBlock.push_back(forkFunction);
        }
    }
    createBlock |= forkFunctionsWithBlock.size();
    for (const auto *forkFunction : forkFunctionsWithBlock) {
        auto *function = createOrGetFunction(forkFunction);
        lastBlock->addFork(forkFunction, function);
    }
    return createBlock;
}